

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall xray_re::xr_level_fog_vol::load(xr_level_fog_vol *this,xr_reader *r)

{
  ushort uVar1;
  ushort *puVar2;
  uint32_t *puVar3;
  
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar1 = *puVar2;
  this->m_version = uVar1;
  if ((uVar1 & 0xfffe) == 2) {
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    xr_reader::
    r_seq<std::vector<xray_re::fog_vol_data*,std::allocator<xray_re::fog_vol_data*>>,read_fog_vol>
              (r,*puVar3,&this->m_fog_vols);
    return;
  }
  __assert_fail("m_version == FOG_VOL_VERSION_2 || m_version == FOG_VOL_VERSION_3",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_fog_vol.cxx"
                ,0x1b,"void xray_re::xr_level_fog_vol::load(xr_reader &)");
}

Assistant:

inline uint16_t xr_reader::r_u16() { return *m_p_u16++; }